

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O1

QVariant * __thiscall
QUndoModel::data(QVariant *__return_storage_ptr__,QUndoModel *this,QModelIndex *index,int role)

{
  int iVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->m_stack == (QUndoStack *)0x0) || (index->c != 0)) || (iVar1 = index->r, iVar1 < 0))
     || (iVar3 = QUndoStack::count(), iVar3 < iVar1)) {
LAB_0066c89f:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    if (role == 1) {
      iVar1 = index->r;
      iVar3 = QUndoStack::cleanIndex();
      if (iVar1 == iVar3) {
        cVar2 = QIcon::isNull();
        if (cVar2 == '\0') {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            QIcon::operator_cast_to_QVariant(__return_storage_ptr__,&this->m_clean_icon);
            return __return_storage_ptr__;
          }
          goto LAB_0066c9b1;
        }
      }
      goto LAB_0066c89f;
    }
    if (role != 0) goto LAB_0066c89f;
    if (index->r == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        ::QVariant::QVariant(__return_storage_ptr__,(QString *)&this->m_emty_label);
        return __return_storage_ptr__;
      }
      goto LAB_0066c9b1;
    }
    QUndoStack::text((int)local_48);
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)local_48);
    if (local_48[0] != (QArrayData *)0x0) {
      LOCK();
      (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48[0],2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0066c9b1:
  __stack_chk_fail();
}

Assistant:

QVariant QUndoModel::data(const QModelIndex &index, int role) const
{
    if (m_stack == nullptr)
        return QVariant();

    if (index.column() != 0)
        return QVariant();

    if (index.row() < 0 || index.row() > m_stack->count())
        return QVariant();

    if (role == Qt::DisplayRole) {
        if (index.row() == 0)
            return m_emty_label;
        return m_stack->text(index.row() - 1);
    } else if (role == Qt::DecorationRole) {
        if (index.row() == m_stack->cleanIndex() && !m_clean_icon.isNull())
            return m_clean_icon;
        return QVariant();
    }

    return QVariant();
}